

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::CumulativeReporterBase::SectionNode>
Catch::Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
          (SectionStats *args)

{
  SectionNode *ptr;
  SectionNode *in_RDI;
  SectionNode *this;
  
  this = in_RDI;
  ptr = (SectionNode *)operator_new(0xd0);
  CumulativeReporterBase::SectionNode::SectionNode(this,&in_RDI->stats);
  unique_ptr<Catch::CumulativeReporterBase::SectionNode>::unique_ptr
            ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)in_RDI,ptr);
  return (unique_ptr<Catch::CumulativeReporterBase::SectionNode>)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }